

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O3

unsigned_long getRecs(PlayerInfo *player)

{
  undefined8 *puVar1;
  long lVar2;
  const_iterator cVar3;
  unsigned_long uVar4;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  puVar1 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
  lVar2 = Jupiter::Config::operator[](&player->varData,puVar1[1],*puVar1);
  local_18._M_len = 4;
  local_18._M_str = "Recs";
  cVar3 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(lVar2 + 0x28),&local_18);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = Jupiter_strtoull_s(*(undefined8 *)
                                ((long)cVar3.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x28),
                               *(undefined8 *)
                                ((long)cVar3.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x30),0);
  }
  return uVar4;
}

Assistant:

unsigned long getRecs(const RenX::PlayerInfo &player)
{
	return player.varData[pluginInstance.getName()].get<unsigned long>("Recs"sv);
}